

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

CompilationStatus * __thiscall
gl3cts::ClipDistance::Utility::Program::compileShader
          (CompilationStatus *__return_storage_ptr__,Program *this,GLenum shader_type,
          GLchar **shader_code)

{
  char *pcVar1;
  int iVar2;
  uint in_EAX;
  GLuint GVar3;
  GLenum GVar4;
  deUint32 err;
  char *__s;
  ulong __n;
  GLint log_size;
  undefined8 uStack_38;
  
  __return_storage_ptr__->shader_id = 0;
  __return_storage_ptr__->shader_compilation_status = 0;
  (__return_storage_ptr__->shader_log)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->shader_log).field_2;
  uStack_38._0_4_ = in_EAX;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__return_storage_ptr__->shader_log,0x1b3c1e9);
  if (shader_code != (GLchar **)0x0) {
    GVar3 = (*this->m_gl->createShader)(shader_type);
    __return_storage_ptr__->shader_id = GVar3;
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x500);
    (*this->m_gl->shaderSource)(__return_storage_ptr__->shader_id,1,shader_code,(GLint *)0x0);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x505);
    (*this->m_gl->compileShader)(__return_storage_ptr__->shader_id);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x509);
    (*this->m_gl->getShaderiv)
              (__return_storage_ptr__->shader_id,0x8b81,
               &__return_storage_ptr__->shader_compilation_status);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x50e);
    if (__return_storage_ptr__->shader_compilation_status == 0) {
      uStack_38 = (ulong)(uint)uStack_38;
      (*this->m_gl->getShaderiv)
                (__return_storage_ptr__->shader_id,0x8b84,(GLint *)((long)&uStack_38 + 4));
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x517);
      iVar2 = uStack_38._4_4_;
      __n = (ulong)uStack_38._4_4_;
      if (__n != 0) {
        __s = (char *)operator_new__(__n);
        memset(__s,0,__n);
        (*this->m_gl->getShaderInfoLog)(__return_storage_ptr__->shader_id,iVar2,(GLsizei *)0x0,__s);
        pcVar1 = (char *)(__return_storage_ptr__->shader_log)._M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace
                  ((ulong)&__return_storage_ptr__->shader_log,0,pcVar1,(ulong)__s);
        operator_delete__(__s);
        err = (*this->m_gl->getError)();
        glu::checkError(err,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x527);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::CompilationStatus gl3cts::ClipDistance::Utility::Program::compileShader(
	const glw::GLenum shader_type, const glw::GLchar* const* shader_code)
{
	CompilationStatus shader = { 0, GL_NONE, "" };

	if (shader_code != DE_NULL)
	{
		try
		{
			/* Creation */
			shader.shader_id = m_gl.createShader(shader_type);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader() call failed.");

			/* Compilation */
			m_gl.shaderSource(shader.shader_id, 1, shader_code, NULL);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glShaderSource() call failed.");

			m_gl.compileShader(shader.shader_id);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCompileShader() call failed.");

			/* Status */
			m_gl.getShaderiv(shader.shader_id, GL_COMPILE_STATUS, &shader.shader_compilation_status);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv() call failed.");

			/* Logging */
			if (shader.shader_compilation_status == GL_FALSE)
			{
				glw::GLint log_size = 0;

				m_gl.getShaderiv(shader.shader_id, GL_INFO_LOG_LENGTH, &log_size);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv() call failed.");

				if (log_size)
				{
					glw::GLchar* log = new glw::GLchar[log_size];

					if (log)
					{
						memset(log, 0, log_size);

						m_gl.getShaderInfoLog(shader.shader_id, log_size, DE_NULL, log);

						shader.shader_log = log;

						delete[] log;

						GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderInfoLog() call failed.");
					}
				}
			}
		}
		catch (...)
		{
			if (shader.shader_id)
			{
				m_gl.deleteShader(shader.shader_id);

				shader.shader_id = 0;
			}
		}
	}

	return shader;
}